

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sectors.cxx
# Opt level: O2

uint16_t __thiscall level_tools::get_sector_idx(level_tools *this,fvector3 *p)

{
  pointer ppsVar1;
  value_type pxVar2;
  bool bVar3;
  const_reference ppxVar4;
  short sVar5;
  pointer ppsVar6;
  float fVar7;
  undefined8 uStack_38;
  
  ppsVar6 = (this->m_sectors->
            super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppsVar1 = (this->m_sectors->
            super__Vector_base<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  uStack_38 = 0x7f7fffffffff0000;
  sVar5 = 0;
  for (; ppsVar6 != ppsVar1; ppsVar6 = ppsVar6 + 1) {
    ppxVar4 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                        (this->m_subdivisions,(ulong)(*ppsVar6)->root);
    pxVar2 = *ppxVar4;
    bVar3 = xray_re::_aabb<float>::contain(&pxVar2->m_bbox,p);
    if (bVar3) {
      fVar7 = xray_re::_aabb<float>::size(&pxVar2->m_bbox);
      if (fVar7 < uStack_38._4_4_) {
        uStack_38 = (ulong)CONCAT42(fVar7,sVar5) << 0x10;
      }
    }
    sVar5 = sVar5 + 1;
  }
  if (uStack_38._2_2_ != 0xffff) {
    return uStack_38._2_2_;
  }
  __assert_fail("sector_idx != (65535)",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sectors.cxx"
                ,0x59,"uint16_t level_tools::get_sector_idx(const fvector3 &) const");
}

Assistant:

uint16_t level_tools::get_sector_idx(const fvector3& p) const
{
	uint16_t sector_idx = UINT16_MAX;
	float size, min_size = xr_numeric_limits<float>::max();
	for (sector_data_vec_cit it0 = m_sectors->begin(), it = it0, end = m_sectors->end();
			it != end; ++it) {
		const fbox& aabb = m_subdivisions->at((*it)->root)->bbox();
		if (aabb.contain(p) && min_size > (size = aabb.size())) {
			min_size = size;
			sector_idx = uint16_t((it - it0) & UINT16_MAX);
		}
	}
	xr_assert(sector_idx != UINT16_MAX);
	return sector_idx;
}